

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

bool __thiscall
dap::Deserializer::deserialize<dap::FunctionBreakpoint>
          (Deserializer *this,array<dap::FunctionBreakpoint> *vec)

{
  int iVar1;
  undefined4 extraout_var;
  size_t i;
  undefined8 local_48;
  array<dap::FunctionBreakpoint> *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_40 = vec;
  iVar1 = (*this->_vptr_Deserializer[8])();
  std::vector<dap::FunctionBreakpoint,_std::allocator<dap::FunctionBreakpoint>_>::resize
            (vec,CONCAT44(extraout_var,iVar1));
  local_48 = 0;
  local_20 = std::
             _Function_handler<bool_(dap::Deserializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:98:14)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(dap::Deserializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:98:14)>
             ::_M_manager;
  local_38._M_unused._M_object = &local_40;
  local_38._8_8_ = &local_48;
  iVar1 = (*this->_vptr_Deserializer[9])(this);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return SUB41(iVar1,0);
}

Assistant:

bool Deserializer::deserialize(dap::array<T>* vec) const {
  auto n = count();
  vec->resize(n);
  size_t i = 0;
  if (!array([&](Deserializer* d) { return d->deserialize(&(*vec)[i++]); })) {
    return false;
  }
  return true;
}